

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
BuildTestStatusFormatReplacePlaceholder::Run(BuildTestStatusFormatReplacePlaceholder *this)

{
  Test *this_00;
  int iVar1;
  string local_30;
  
  this_00 = g_current_test;
  StatusPrinter::FormatProgressStatus_abi_cxx11_
            (&local_30,&(this->super_BuildTest).status_,"[%%/s%s/t%t/r%r/u%u/f%f]",0);
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  testing::Test::Check
            (this_00,iVar1 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x840,
             "\"[%/s0/t0/r0/u0/f0]\" == status_.FormatProgressStatus(\"[%%/s%s/t%t/r%r/u%u/f%f]\", 0)"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTest, StatusFormatReplacePlaceholder) {
  EXPECT_EQ("[%/s0/t0/r0/u0/f0]",
            status_.FormatProgressStatus("[%%/s%s/t%t/r%r/u%u/f%f]", 0));
}